

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O1

void canvas_undo_cleardirty(_glist *x)

{
  _glist *x_00;
  int iVar1;
  _undo *p_Var2;
  
  p_Var2 = canvas_undo_get(x);
  if (p_Var2 != (_undo *)0x0) {
    p_Var2->u_cleanstate = p_Var2->u_last;
  }
  for (x_00 = (_glist *)x->gl_list; x_00 != (_glist *)0x0;
      x_00 = (_glist *)(x_00->gl_obj).te_g.g_next) {
    if (((x_00->gl_obj).te_g.g_pd == canvas_class) &&
       (iVar1 = canvas_isabstraction(x_00), iVar1 == 0)) {
      canvas_undo_cleardirty(x_00);
    }
  }
  return;
}

Assistant:

void canvas_undo_cleardirty(t_canvas *x)
{
        /* clear dirty flags of this canvas
         * and all sub-canvases (but not abstractions/
         */
    t_gobj*y;
    canvas_undo_docleardirty(x);
    for(y=x->gl_list; y; y=y->g_next)
        if (pd_class(&y->g_pd) == canvas_class && !canvas_isabstraction((t_canvas*)y))
            canvas_undo_cleardirty((t_canvas*)y);
}